

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

SampledSpectrum
pbrt::detail::
DispatchCPU<pbrt::Light::Phi(pbrt::SampledWavelengths)const::__0&,pbrt::SampledSpectrum,pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight,void>
          (anon_class_8_1_5ef94505 *func,void *ptr,int index)

{
  array<float,_4> aVar1;
  uint in_EDX;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  SampledSpectrum SVar22;
  ProjectionLight *in_stack_00000008;
  undefined4 in_stack_00000010;
  void *in_stack_ffffffffffffffc8;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar11 [56];
  undefined1 auVar21 [56];
  
  auVar21 = in_ZMM1._8_56_;
  auVar11 = in_ZMM0._8_56_;
  switch((anon_class_8_1_5ef94505 *)(ulong)in_EDX) {
  case (anon_class_8_1_5ef94505 *)0x0:
    SVar22 = const::$_0::operator()
                       ((anon_class_8_1_5ef94505 *)CONCAT44(index,in_stack_00000010),
                        (PointLight *)in_stack_00000008);
    auVar12._0_8_ = SVar22.values.values._8_8_;
    auVar12._8_56_ = auVar21;
    auVar2._0_8_ = SVar22.values.values._0_8_;
    auVar2._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar2._0_16_);
    local_8 = vmovlpd_avx(auVar12._0_16_);
    break;
  case (anon_class_8_1_5ef94505 *)0x1:
    SVar22 = const::$_0::operator()
                       ((anon_class_8_1_5ef94505 *)CONCAT44(index,in_stack_00000010),
                        (DistantLight *)in_stack_00000008);
    auVar13._0_8_ = SVar22.values.values._8_8_;
    auVar13._8_56_ = auVar21;
    auVar3._0_8_ = SVar22.values.values._0_8_;
    auVar3._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar3._0_16_);
    local_8 = vmovlpd_avx(auVar13._0_16_);
    break;
  case (anon_class_8_1_5ef94505 *)0x2:
    SVar22 = const::$_0::operator()
                       ((anon_class_8_1_5ef94505 *)CONCAT44(index,in_stack_00000010),
                        in_stack_00000008);
    auVar14._0_8_ = SVar22.values.values._8_8_;
    auVar14._8_56_ = auVar21;
    auVar4._0_8_ = SVar22.values.values._0_8_;
    auVar4._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar4._0_16_);
    local_8 = vmovlpd_avx(auVar14._0_16_);
    break;
  case (anon_class_8_1_5ef94505 *)0x3:
    SVar22 = const::$_0::operator()
                       ((anon_class_8_1_5ef94505 *)CONCAT44(index,in_stack_00000010),
                        (GoniometricLight *)in_stack_00000008);
    auVar15._0_8_ = SVar22.values.values._8_8_;
    auVar15._8_56_ = auVar21;
    auVar5._0_8_ = SVar22.values.values._0_8_;
    auVar5._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar5._0_16_);
    local_8 = vmovlpd_avx(auVar15._0_16_);
    break;
  case (anon_class_8_1_5ef94505 *)0x4:
    SVar22 = const::$_0::operator()
                       ((anon_class_8_1_5ef94505 *)CONCAT44(index,in_stack_00000010),
                        (SpotLight *)in_stack_00000008);
    auVar16._0_8_ = SVar22.values.values._8_8_;
    auVar16._8_56_ = auVar21;
    auVar6._0_8_ = SVar22.values.values._0_8_;
    auVar6._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar6._0_16_);
    local_8 = vmovlpd_avx(auVar16._0_16_);
    break;
  case (anon_class_8_1_5ef94505 *)0x5:
    SVar22 = const::$_0::operator()
                       ((anon_class_8_1_5ef94505 *)CONCAT44(index,in_stack_00000010),
                        (DiffuseAreaLight *)in_stack_00000008);
    auVar17._0_8_ = SVar22.values.values._8_8_;
    auVar17._8_56_ = auVar21;
    auVar7._0_8_ = SVar22.values.values._0_8_;
    auVar7._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar7._0_16_);
    local_8 = vmovlpd_avx(auVar17._0_16_);
    break;
  case (anon_class_8_1_5ef94505 *)0x6:
    SVar22 = const::$_0::operator()
                       ((anon_class_8_1_5ef94505 *)CONCAT44(index,in_stack_00000010),
                        (UniformInfiniteLight *)in_stack_00000008);
    auVar18._0_8_ = SVar22.values.values._8_8_;
    auVar18._8_56_ = auVar21;
    auVar8._0_8_ = SVar22.values.values._0_8_;
    auVar8._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar8._0_16_);
    local_8 = vmovlpd_avx(auVar18._0_16_);
    break;
  case (anon_class_8_1_5ef94505 *)0x7:
    SVar22 = const::$_0::operator()
                       ((anon_class_8_1_5ef94505 *)CONCAT44(index,in_stack_00000010),
                        (ImageInfiniteLight *)in_stack_00000008);
    auVar19._0_8_ = SVar22.values.values._8_8_;
    auVar19._8_56_ = auVar21;
    auVar9._0_8_ = SVar22.values.values._0_8_;
    auVar9._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar9._0_16_);
    local_8 = vmovlpd_avx(auVar19._0_16_);
    break;
  default:
    SVar22 = DispatchCPU<pbrt::Light::Phi(pbrt::SampledWavelengths)const::__0&,pbrt::SampledSpectrum,pbrt::PortalImageInfiniteLight>
                       ((anon_class_8_1_5ef94505 *)(ulong)in_EDX,in_stack_ffffffffffffffc8,0);
    auVar20._0_8_ = SVar22.values.values._8_8_;
    auVar20._8_56_ = auVar21;
    auVar10._0_8_ = SVar22.values.values._0_8_;
    auVar10._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar10._0_16_);
    local_8 = vmovlpd_avx(auVar20._0_16_);
  }
  aVar1.values[2] = (float)(undefined4)local_8;
  aVar1.values[3] = (float)local_8._4_4_;
  aVar1.values[0] = (float)(undefined4)local_10;
  aVar1.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

auto DispatchCPU(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    case 3:
        return func((const T3 *)ptr);
    case 4:
        return func((const T4 *)ptr);
    case 5:
        return func((const T5 *)ptr);
    case 6:
        return func((const T6 *)ptr);
    case 7:
        return func((const T7 *)ptr);
    default:
        return DispatchCPU<F, R, Ts...>(func, ptr, index - 8);
    }
}